

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void csrPrintDense(char *s,CUPDLPcsr *csr)

{
  long lVar1;
  cupdlp_int *pcVar2;
  long lVar3;
  long lVar4;
  cupdlp_int cVar5;
  
  puts("------------------------------------------------");
  printf("%s:\n",s);
  if (0 < csr->nRows) {
    lVar4 = 0;
    do {
      pcVar2 = csr->rowMatBeg;
      lVar3 = (long)pcVar2[lVar4];
      lVar1 = lVar4 + 1;
      if (pcVar2[lVar4] < pcVar2[lVar4 + 1]) {
        do {
          if (pcVar2[lVar4] == (int)lVar3) {
            cVar5 = csr->rowMatIdx[lVar3];
          }
          else {
            cVar5 = ~csr->rowMatIdx[lVar3 + -1] + csr->rowMatIdx[lVar3];
          }
          if (0 < cVar5) {
            do {
              printf("       ");
              cVar5 = cVar5 + -1;
            } while (cVar5 != 0);
          }
          printf("%6.3f ",csr->rowMatElem[lVar3]);
          lVar3 = lVar3 + 1;
          pcVar2 = csr->rowMatBeg;
        } while (lVar3 < pcVar2[lVar1]);
      }
      putchar(10);
      lVar4 = lVar1;
    } while (lVar1 < csr->nRows);
  }
  puts("------------------------------------------------");
  return;
}

Assistant:

void csrPrintDense(const char *s, CUPDLPcsr *csr) {
  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("%s:\n", s);
  cupdlp_int deltaCol = 0;
  for (cupdlp_int iRow = 0; iRow < csr->nRows; ++iRow) {
    for (cupdlp_int iElem = csr->rowMatBeg[iRow];
         iElem < csr->rowMatBeg[iRow + 1]; ++iElem) {
      if (iElem == csr->rowMatBeg[iRow])
        deltaCol = csr->rowMatIdx[iElem];
      else
        deltaCol = csr->rowMatIdx[iElem] - csr->rowMatIdx[iElem - 1] - 1;
      for (cupdlp_int i = 0; i < deltaCol; ++i) {
        cupdlp_printf("       ");
      }
      cupdlp_printf("%6.3f ", csr->rowMatElem[iElem]);
    }
    cupdlp_printf("\n");
  }
  cupdlp_printf("------------------------------------------------\n");
}